

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O2

void njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearAmplitudeExpansion::
     verifySize(int NW,int NL)

{
  char *in_RAX;
  undefined8 *puVar1;
  
  if ((NL * 3 + 3 != NW) && (NL * 4 + 3 != NW)) {
    tools::Log::error<char_const*>(in_RAX);
    tools::Log::info<char_const*>(in_RAX);
    tools::Log::info<char_const*,int>("NW value: {}",NW);
    tools::Log::info<char_const*,int>("NL value: {}",NL);
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = getenv;
    __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
  }
  return;
}

Assistant:

static void
verifySize( int NW, int NL ) {

  if ( ( NW != 3 * NL + 3 ) and ( NW != 4 * NL + 3 ) ) {

    Log::error( "Encountered illegal NW and NL values" );
    Log::info( "NW must be equal to 3*NL+3 or 4*NL+3 for "
               "nuclear amplitude expansion" );
    Log::info( "NW value: {}", NW );
    Log::info( "NL value: {}", NL );
    throw std::exception();
  }
}